

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

Index __thiscall
MADPComponentDiscreteObservations::GetObservationIndexByName
          (MADPComponentDiscreteObservations *this,string *s,Index agentI)

{
  pointer pvVar1;
  pointer pOVar2;
  pointer pcVar3;
  size_t __n;
  int iVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  E *this_00;
  ulong uVar7;
  ulong uVar8;
  Index unaff_EBP;
  pointer pOVar9;
  bool bVar10;
  stringstream ss;
  long *local_1b8;
  size_t local_1b0;
  long local_1a8 [47];
  
  if (this->_m_initialized == false) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"MADPComponentDiscreteObservations::GetObservationIndexByName - not initialized!");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  uVar8 = (ulong)agentI;
  pvVar1 = (this->_m_observationVecs).
           super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_m_observationVecs).
                 super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar8 <= uVar7 && uVar7 - uVar8 != 0) {
    pOVar9 = pvVar1[uVar8].
             super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar2 = *(pointer *)
              ((long)&pvVar1[uVar8].
                      super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
                      _M_impl.super__Vector_impl_data + 8);
    do {
      if (pOVar9 == pOVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GetObservationIndexByName - observation \"",0x29);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" of agent ",0xb);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," not found.",0xb);
        std::endl<char,std::char_traits<char>>(poVar5);
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        std::__cxx11::stringbuf::str();
        __cxa_throw(puVar6,&E::typeinfo,E::~E);
      }
      pcVar3 = (pOVar9->super_Observation).super_NamedDescribedEntity._m_name._M_dataplus._M_p;
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar3,
                 pcVar3 + *(size_type *)
                           ((long)&(pOVar9->super_Observation).super_NamedDescribedEntity._m_name +
                           8));
      __n = s->_M_string_length;
      if (__n == local_1b0) {
        if (__n == 0) {
          bVar10 = true;
        }
        else {
          iVar4 = bcmp((s->_M_dataplus)._M_p,local_1b8,__n);
          bVar10 = iVar4 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      if (bVar10) {
        unaff_EBP = (pOVar9->super_DiscreteEntity)._m_index;
      }
      else {
        pOVar9 = pOVar9 + 1;
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
    } while (!bVar10);
    return unaff_EBP;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"GetObservationIndexByName -  Agent index (",0x2a);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,") out of bounds! (_m_observationVecs contains observations",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," for ",5);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," agents...)\n",0xc);
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar6 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar6,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteObservations::GetObservationIndexByName(const string &s,
                                                                   Index agentI) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteObservations::GetObservationIndexByName - not initialized!");
    if(agentI >= _m_observationVecs.size())
    {
        stringstream ss;
        ss << "GetObservationIndexByName -  Agent index ("<<
            agentI<<") out of bounds! (_m_observationVecs contains observations"
            <<" for " << _m_observationVecs.size() << " agents...)\n";
        throw E(ss);
    }
    vector<ObservationDiscrete>::const_iterator it = 
    _m_observationVecs[agentI].begin();
    vector<ObservationDiscrete>::const_iterator last = 
    _m_observationVecs[agentI].end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    //return(-1);
    stringstream ss;
    ss << "GetObservationIndexByName - observation \"" << s << "\" of agent " <<
           agentI << " not found." << endl;
    throw E(ss);
}